

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O1

int arkStep_NlsResidual_MassTDep(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"arkStep_NlsResidual_MassTDep",&local_18,&local_20);
  if (iVar1 == 0) {
    N_VLinearSum(1.0,local_20->zpred,1.0,zcor,local_18->ycur);
    N_VLinearSum(1.0,zcor,-1.0,local_20->sdata,local_20->Fi[local_20->istage]);
    iVar2 = (*local_20->mmult)(local_18,local_20->Fi[local_20->istage],r);
    iVar1 = -0x12;
    if (iVar2 == 0) {
      iVar2 = (*local_20->nls_fi)(local_18->tcur,local_18->ycur,local_20->Fi[local_20->istage],
                                  local_18->user_data);
      local_20->nfi = local_20->nfi + 1;
      if (iVar2 < 0) {
        iVar1 = -8;
      }
      else {
        iVar1 = 9;
        if (iVar2 == 0) {
          N_VLinearSum(1.0,r,-local_20->gamma,local_20->Fi[local_20->istage],r);
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsResidual_MassTDep(N_Vector zcor, N_Vector r, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_NlsResidual_MassTDep",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* put M*(zcor - sdata) in r (use Fi[is] as temporary storage) */
  N_VLinearSum(ONE, zcor, -ONE, step_mem->sdata, step_mem->Fi[step_mem->istage]);
  retval = step_mem->mmult((void *) ark_mem, step_mem->Fi[step_mem->istage], r);
  if (retval != ARK_SUCCESS)  return (ARK_MASSMULT_FAIL);

  /* compute implicit RHS */
  retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage],
                            ark_mem->user_data);
  step_mem->nfi++;
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* compute residual via linear sum */
  N_VLinearSum(ONE, r, -step_mem->gamma, step_mem->Fi[step_mem->istage], r);
  return(ARK_SUCCESS);
}